

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dll.c
# Opt level: O3

nsync_dll_list_ nsync::nsync_dll_make_last_in_list_(nsync_dll_list_ list,nsync_dll_element_ *e)

{
  nsync_dll_element_s_ *pnVar1;
  nsync_dll_element_s_ *pnVar2;
  nsync_dll_element_s_ *pnVar3;
  nsync_dll_list_ pnVar4;
  
  pnVar4 = list;
  if (e != (nsync_dll_element_ *)0x0) {
    pnVar1 = e->next;
    pnVar4 = e;
    if (list != (nsync_dll_list_)0x0 && pnVar1 != (nsync_dll_element_s_ *)0x0) {
      pnVar2 = list->next;
      pnVar3 = pnVar1->prev;
      list->next = pnVar1;
      pnVar1->prev = list;
      pnVar3->next = pnVar2;
      pnVar2->prev = pnVar3;
      return e;
    }
  }
  return pnVar4;
}

Assistant:

nsync_dll_list_ nsync_dll_make_last_in_list_ (nsync_dll_list_ list, nsync_dll_element_ *e) {
	if (e != NULL) {
		nsync_dll_make_first_in_list_ (list, e->next);
		list = e;
	}
	return (list);
}